

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  int *res;
  uint uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t n;
  size_t len;
  
  puVar2 = *p;
  if (end == puVar2 || (long)end - (long)puVar2 < 0) {
    iVar4 = -0x2460;
  }
  else {
    if (*puVar2 == '\x17') {
      n = 2;
      bVar3 = true;
    }
    else {
      if (*puVar2 != '\x18') {
        return -0x2462;
      }
      n = 4;
      bVar3 = false;
    }
    *p = puVar2 + 1;
    iVar4 = mbedtls_asn1_get_len(p,end,&len);
    if (iVar4 == 0) {
      iVar6 = -0x2400;
      uVar7 = len - (n + 8);
      iVar4 = iVar6;
      if ((n + 8 <= len) && (iVar4 = x509_parse_int(p,n,&time->year), iVar4 == 0)) {
        if (bVar3) {
          iVar4 = time->year;
          iVar5 = iVar4 + 100;
          if (0x31 < iVar4) {
            iVar5 = iVar4;
          }
          time->year = iVar5 + 0x76c;
        }
        iVar4 = x509_parse_int(p,2,&time->mon);
        if (iVar4 == 0) {
          res = &time->day;
          iVar4 = x509_parse_int(p,2,res);
          if (iVar4 == 0) {
            iVar4 = x509_parse_int(p,2,&time->hour);
            if (iVar4 == 0) {
              iVar4 = x509_parse_int(p,2,&time->min);
              if ((iVar4 == 0) && (iVar4 = iVar6, 1 < uVar7)) {
                iVar4 = x509_parse_int(p,2,&time->sec);
                if (iVar4 == 0) {
                  if (uVar7 != 2) {
                    if (uVar7 != 3) {
                      return -0x2400;
                    }
                    if (**p != 'Z') {
                      return -0x2400;
                    }
                    *p = *p + 1;
                  }
                  iVar4 = iVar6;
                  if (((((uint)time->year < 10000) && ((uint)time->hour < 0x18)) &&
                      ((uint)time->min < 0x3c)) &&
                     (((uint)time->sec < 0x3c && (uVar1 = time->mon, uVar1 < 0xd)))) {
                    if ((0x15aaU >> (uVar1 & 0x1f) & 1) == 0) {
                      if ((0xa50U >> (uVar1 & 0x1f) & 1) == 0) {
                        if (uVar1 != 2) {
                          return -0x2400;
                        }
                        if (*res < 1) {
                          return -0x2400;
                        }
                        if (((time->year & 3U) == 0) + 0x1c < (uint)*res) {
                          return -0x2400;
                        }
                      }
                      else if (*res - 0x1fU < 0xffffffe2) {
                        return -0x2400;
                      }
                    }
                    else if (*res - 0x20U < 0xffffffe1) {
                      return -0x2400;
                    }
                    iVar4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar4 = iVar4 + -0x2400;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len, year_len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
        year_len = 2;
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
        year_len = 4;
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;
    ret = mbedtls_asn1_get_len( p, end, &len );

    if( ret != 0 )
        return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

    return x509_parse_time( p, len, year_len, time );
}